

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O1

ostream * Diligent::Parsing::WriteToken<Diligent::Parsing::HLSLTokenInfo>
                    (ostream *stream,HLSLTokenInfo *Token)

{
  size_type sVar1;
  pointer pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,(Token->Delimiter)._M_dataplus._M_p,(Token->Delimiter)._M_string_length);
  if (Token->Type == StringConstant) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,(Token->Literal)._M_dataplus._M_p,(Token->Literal)._M_string_length);
    sVar1 = 1;
    pcVar2 = "\"";
  }
  else {
    pcVar2 = (Token->Literal)._M_dataplus._M_p;
    sVar1 = (Token->Literal)._M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,sVar1);
  return stream;
}

Assistant:

std::ostream& WriteToken(std::ostream& stream, const TokenClass& Token)
{
    Token.OutputDelimiter(stream);

    const auto Type = Token.GetType();
    using TokenType = decltype(Type);
    if (Type == TokenType::StringConstant)
        stream << "\"";
    Token.OutputLiteral(stream);
    if (Type == TokenType::StringConstant)
        stream << "\"";

    return stream;
}